

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  ArrayDisposer *params;
  Detail *pDVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  long lVar4;
  long lVar5;
  Promise<void> PVar6;
  OwnPromiseNode OVar7;
  void *pvVar8;
  RemoveConst<kj::Exception::Detail> *in_RCX;
  long lVar9;
  _func_int **pp_Var10;
  TransformPromiseNodeBase *pTVar11;
  _func_int *p_Var12;
  Exception *this_00;
  RemoveConst<kj::Exception::Detail> *pRVar13;
  Fault FVar14;
  RemoveConst<kj::Exception::Detail> *pRVar15;
  _func_int **pp_Var16;
  _func_int **pp_Var17;
  bool bVar18;
  Promise<void> promise;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_bf;
  OwnPromiseNode intermediate;
  Fault f;
  OwnPromiseNode local_58;
  TransformPromiseNodeBase *local_50;
  OwnPromiseNode local_48;
  OwnPromiseNode local_40;
  uint64_t n;
  
  bVar18 = output[0xc]._vptr_AsyncOutputStream == (_func_int **)0x0;
  _kjCondition.value = bVar18;
  if (!bVar18) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,600,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  params = (ArrayDisposer *)(output + 0xc);
  pRVar15 = (RemoveConst<kj::Exception::Detail> *)output[5]._vptr_AsyncOutputStream;
  if (in_RCX < pRVar15) {
    (*(code *)**(undefined8 **)amount)(&f,amount,output[4]._vptr_AsyncOutputStream);
    FVar14 = f;
    pDVar1 = (Detail *)output[2]._vptr_AsyncOutputStream;
    pvVar8 = (void *)((f.exception)->ownFile).content.size_;
    if (pvVar8 == (void *)0x0 || (ulong)((long)f.exception - (long)pvVar8) < 0x40) {
      pvVar8 = operator_new(0x400);
      pTVar11 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar11,(OwnPromiseNode *)&f,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:605:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_16_2_34952053_for_func::operator());
      *(undefined ***)((long)pvVar8 + 0x3c0) = &PTR_destroy_006df5a8;
      *(AsyncOutputStream **)((long)pvVar8 + 0x3e0) = output;
      *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 1000) = in_RCX;
      *(Detail **)((long)pvVar8 + 0x3f0) = pDVar1;
      *(ArrayDisposer **)((long)pvVar8 + 0x3f8) = params;
      *(void **)((long)pvVar8 + 0x3c8) = pvVar8;
    }
    else {
      ((f.exception)->ownFile).content.size_ = 0;
      pTVar11 = (TransformPromiseNodeBase *)(f.exception[-1].trace + 0x1d);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar11,(OwnPromiseNode *)&f,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:605:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_16_2_34952053_for_func::operator());
      FVar14.exception[-1].trace[0x1d] = &PTR_destroy_006df5a8;
      FVar14.exception[-1].details.builder.ptr = (Detail *)output;
      FVar14.exception[-1].details.builder.pos = in_RCX;
      FVar14.exception[-1].details.builder.endPtr = pDVar1;
      FVar14.exception[-1].details.builder.disposer = params;
      FVar14.exception[-1].trace[0x1e] = pvVar8;
    }
    local_40.ptr = &pTVar11->super_PromiseNode;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)this,(Canceler *)params,(Promise<unsigned_long> *)&local_40);
    OVar7.ptr = local_40.ptr;
    if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
      local_40.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
    }
    FVar14.exception = f.exception;
    if (f.exception == (Exception *)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    f.exception = (Exception *)0x0;
  }
  else {
    pp_Var2 = output[7]._vptr_AsyncOutputStream;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var17 = (_func_int **)0x0;
    }
    else {
      pp_Var10 = output[6]._vptr_AsyncOutputStream + 1;
      pp_Var16 = (_func_int **)0x0;
      do {
        pRVar13 = (RemoveConst<kj::Exception::Detail> *)(*pp_Var10 + (long)pRVar15);
        pp_Var17 = pp_Var16;
        if (in_RCX < pRVar13) break;
        pp_Var16 = (_func_int **)((long)pp_Var16 + 1);
        pp_Var10 = pp_Var10 + 2;
        pRVar15 = pRVar13;
        pp_Var17 = pp_Var2;
      } while (pp_Var2 != pp_Var16);
    }
    (*(code *)**(undefined8 **)amount)(&promise,amount,output[4]._vptr_AsyncOutputStream);
    PVar6 = promise;
    if (pp_Var17 != (_func_int **)0x0) {
      pp_Var2 = output[6]._vptr_AsyncOutputStream;
      lVar9 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
      if (lVar9 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar9) < 0x38) {
        pvVar8 = operator_new(0x400);
        pTVar11 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3c8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar11,(OwnPromiseNode *)&promise,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:626:32)>
                   ::anon_class_24_2_d8a1eacd_for_func::operator());
        *(undefined ***)((long)pvVar8 + 0x3c8) = &PTR_destroy_006df600;
        *(uint64_t *)((long)pvVar8 + 1000) = amount;
        *(_func_int ***)((long)pvVar8 + 0x3f0) = pp_Var2;
        *(_func_int ***)((long)pvVar8 + 0x3f8) = pp_Var17;
        *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
      }
      else {
        *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
        pTVar11 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x38);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar11,(OwnPromiseNode *)&promise,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:626:32)>
                   ::anon_class_24_2_d8a1eacd_for_func::operator());
        *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x38) = &PTR_destroy_006df600;
        *(uint64_t *)((long)PVar6.super_PromiseBase.node.ptr + -0x18) = amount;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = pp_Var2;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -8) = pp_Var17;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = lVar9;
      }
      f.exception = (Exception *)&DAT_004ddfe0;
      intermediate.ptr = &pTVar11->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
      OVar7.ptr = intermediate.ptr;
      FVar14.exception = __kjCondition;
      if (intermediate.ptr != (PromiseNode *)0x0) {
        intermediate.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
      PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
      promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)FVar14.exception;
      if (PVar6.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar6.super_PromiseBase.node.ptr);
      }
    }
    PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
    pp_Var2 = output[7]._vptr_AsyncOutputStream;
    if (pp_Var17 == pp_Var2) {
      pp_Var2 = output[2]._vptr_AsyncOutputStream;
      lVar9 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
      if (lVar9 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar9) < 0x50) {
        pvVar8 = operator_new(0x400);
        this_00 = (Exception *)((long)pvVar8 + 0x3b0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:631:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_32_4_246a692a_for_func::operator());
        *(undefined ***)((long)pvVar8 + 0x3b0) = &PTR_destroy_006df6b0;
        *(AsyncOutputStream **)((long)pvVar8 + 0x3d0) = output;
        *(uint64_t *)((long)pvVar8 + 0x3d8) = amount;
        *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 0x3e0) = in_RCX;
        *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 1000) = pRVar15;
        *(_func_int ***)((long)pvVar8 + 0x3f0) = pp_Var2;
        *(ArrayDisposer **)((long)pvVar8 + 0x3f8) = params;
        *(void **)((long)pvVar8 + 0x3b8) = pvVar8;
      }
      else {
        *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
        this_00 = (Exception *)((long)promise.super_PromiseBase.node.ptr + -0x50);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:631:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_32_4_246a692a_for_func::operator());
        *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x50) = &PTR_destroy_006df6b0;
        *(AsyncOutputStream **)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = output;
        *(uint64_t *)((long)PVar6.super_PromiseBase.node.ptr + -0x28) = amount;
        *(RemoveConst<kj::Exception::Detail> **)((long)PVar6.super_PromiseBase.node.ptr + -0x20) =
             in_RCX;
        *(RemoveConst<kj::Exception::Detail> **)((long)PVar6.super_PromiseBase.node.ptr + -0x18) =
             pRVar15;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = pp_Var2;
        *(ArrayDisposer **)((long)PVar6.super_PromiseBase.node.ptr + -8) = params;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x48) = lVar9;
      }
      f.exception = (Exception *)anon_var_dwarf_d0108e;
      __kjCondition = this_00;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_58,(OwnPromiseNode *)&_kjCondition,(SourceLocation *)&f);
      FVar14.exception = __kjCondition;
      if (__kjCondition != (Exception *)0x0) {
        __kjCondition = (Exception *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)FVar14.exception);
      }
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
                ((PromiseDisposer *)this,(Canceler *)params,(Promise<unsigned_long> *)&local_58);
      OVar7.ptr = local_58.ptr;
      if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_58.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
    }
    else {
      p_Var12 = (_func_int *)((long)in_RCX - (long)pRVar15);
      f.exception = (Exception *)&n;
      pp_Var10 = output[6]._vptr_AsyncOutputStream;
      p_Var3 = pp_Var10[(long)pp_Var17 * 2];
      lVar9 = (long)pp_Var10[(long)pp_Var17 * 2 + 1] - (long)p_Var12;
      n = (uint64_t)p_Var12;
      if (pp_Var10[(long)pp_Var17 * 2 + 1] < p_Var12) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x288,FAILED,"n <= splitPiece.size()","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long> *)&f);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      if (in_RCX != pRVar15) {
        lVar4 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
        if (lVar4 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar4) < 0x38) {
          pvVar8 = operator_new(0x400);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)((long)pvVar8 + 0x3c8),(OwnPromiseNode *)&promise,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:653:34)>
                     ::anon_class_24_2_e72e484a_for_func::operator());
          *(undefined ***)((long)pvVar8 + 0x3c8) = &PTR_destroy_006df708;
          *(uint64_t *)((long)pvVar8 + 1000) = amount;
          *(_func_int **)((long)pvVar8 + 0x3f0) = p_Var3;
          *(_func_int **)((long)pvVar8 + 0x3f8) = p_Var12;
          *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
          intermediate.ptr = (PromiseNode *)((long)pvVar8 + 0x3c8);
        }
        else {
          *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
          local_50 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x38);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (local_50,(OwnPromiseNode *)&promise,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:653:34)>
                     ::anon_class_24_2_e72e484a_for_func::operator());
          *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x38) = &PTR_destroy_006df708;
          *(uint64_t *)((long)PVar6.super_PromiseBase.node.ptr + -0x18) = amount;
          *(_func_int **)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = p_Var3;
          *(_func_int **)((long)PVar6.super_PromiseBase.node.ptr + -8) = p_Var12;
          *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = lVar4;
          intermediate.ptr = &local_50->super_PromiseNode;
        }
        f.exception = (Exception *)&DAT_004ddfe0;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
        OVar7.ptr = intermediate.ptr;
        FVar14.exception = __kjCondition;
        if (intermediate.ptr != (PromiseNode *)0x0) {
          intermediate.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
        }
        PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
        promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)FVar14.exception;
        if (PVar6.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar6.super_PromiseBase.node.ptr);
        }
      }
      PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
      lVar4 = (long)pp_Var2 - ((long)pp_Var17 + 1);
      pp_Var2 = output[2]._vptr_AsyncOutputStream;
      lVar5 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
      if (lVar5 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar5) < 0x60) {
        pvVar8 = operator_new(0x400);
        pTVar11 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3a0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar11,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:658:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                   ::anon_class_48_4_354179c9_for_func::operator());
        *(undefined ***)((long)pvVar8 + 0x3a0) = &PTR_destroy_006df760;
        *(AsyncOutputStream **)((long)pvVar8 + 0x3c0) = output;
        *(_func_int **)((long)pvVar8 + 0x3c8) = p_Var3 + (long)p_Var12;
        *(long *)((long)pvVar8 + 0x3d0) = lVar9;
        *(_func_int ***)((long)pvVar8 + 0x3d8) = pp_Var10 + ((long)pp_Var17 + 1) * 2;
        *(long *)((long)pvVar8 + 0x3e0) = lVar4;
        *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 1000) = in_RCX;
        *(_func_int ***)((long)pvVar8 + 0x3f0) = pp_Var2;
        *(ArrayDisposer **)((long)pvVar8 + 0x3f8) = params;
        *(void **)((long)pvVar8 + 0x3a8) = pvVar8;
      }
      else {
        *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
        pTVar11 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x60);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar11,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:658:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                   ::anon_class_48_4_354179c9_for_func::operator());
        *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x60) = &PTR_destroy_006df760;
        *(AsyncOutputStream **)((long)PVar6.super_PromiseBase.node.ptr + -0x40) = output;
        *(_func_int **)((long)PVar6.super_PromiseBase.node.ptr + -0x38) = p_Var3 + (long)p_Var12;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = lVar9;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x28) =
             pp_Var10 + ((long)pp_Var17 + 1) * 2;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x20) = lVar4;
        *(RemoveConst<kj::Exception::Detail> **)((long)PVar6.super_PromiseBase.node.ptr + -0x18) =
             in_RCX;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = pp_Var2;
        *(ArrayDisposer **)((long)PVar6.super_PromiseBase.node.ptr + -8) = params;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x58) = lVar5;
      }
      local_48.ptr = &pTVar11->super_PromiseNode;
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
                ((PromiseDisposer *)this,(Canceler *)params,(Promise<unsigned_long> *)&local_48);
      OVar7.ptr = local_48.ptr;
      if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
        local_48.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
    }
    FVar14.exception = (Exception *)promise.super_PromiseBase.node.ptr;
    if (promise.super_PromiseBase.node.ptr == (OwnPromiseNode)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  }
  kj::_::PromiseDisposer::dispose((PromiseArenaMember *)FVar14.exception);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}